

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O0

Status __thiscall
leveldb::SpecialEnv::NewWritableFile(std::__cxx11::string_const&,leveldb::WritableFile**)::
ManifestFile::Append(leveldb::Slice_const__(void *this,Slice *data)

{
  bool bVar1;
  undefined8 in_RDX;
  Slice local_40;
  Slice local_30;
  undefined8 local_20;
  Slice *data_local;
  ManifestFile *this_local;
  
  local_20 = in_RDX;
  data_local = data;
  this_local = (ManifestFile *)this;
  bVar1 = std::atomic<bool>::load((atomic<bool> *)(data->size_ + 0x15),memory_order_acquire);
  if (bVar1) {
    Slice::Slice(&local_30,"simulated writer error");
    Slice::Slice(&local_40);
    Status::IOError((Status *)this,&local_30,&local_40);
  }
  else {
    (**(code **)(*(long *)data[1].data_ + 0x10))(this,data[1].data_,local_20);
  }
  return (Status)(char *)this;
}

Assistant:

Status Append(const Slice& data) {
        if (env_->manifest_write_error_.load(std::memory_order_acquire)) {
          return Status::IOError("simulated writer error");
        } else {
          return base_->Append(data);
        }
      }